

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::SetWindowSize(char *name,ImVec2 *size,ImGuiSetCond cond)

{
  ImGuiWindow *window;
  
  window = FindWindowByName(name);
  if (window != (ImGuiWindow *)0x0) {
    ::SetWindowSize(window,size,cond);
    return;
  }
  return;
}

Assistant:

void ImGui::SetWindowSize(const char* name, const ImVec2& size, ImGuiSetCond cond)
{
    ImGuiWindow* window = FindWindowByName(name);
    if (window)
        SetWindowSize(window, size, cond);
}